

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O0

void saa1099m_write(void *info,UINT8 offset,UINT8 data)

{
  UINT8 data_local;
  UINT8 offset_local;
  void *info_local;
  
  if ((offset & 1) == 0) {
    saa1099_data_w(info,data);
  }
  else {
    saa1099_control_w(info,data);
  }
  return;
}

Assistant:

static void saa1099m_write(void *info, UINT8 offset, UINT8 data)
{
	if (offset & 1)
		saa1099_control_w(info, data);
	else
		saa1099_data_w(info, data);
}